

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalOrder::GetGlobalSinkState(PhysicalOrder *this,ClientContext *context)

{
  bool bVar1;
  ClientConfig *pCVar2;
  pointer pOVar3;
  idx_t iVar4;
  ClientContext *in_RDX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::OrderGlobalSinkState_*,_false> local_98;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_90;
  RowLayout payload_layout;
  
  RowLayout::RowLayout(&payload_layout);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_90,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &context->registered_state);
  RowLayout::Initialize(&payload_layout,(vector<duckdb::LogicalType,_true> *)&local_90,true);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_90);
  make_uniq<duckdb::OrderGlobalSinkState,duckdb::ClientContext&,duckdb::PhysicalOrder_const&,duckdb::RowLayout&>
            ((duckdb *)&local_98,in_RDX,(PhysicalOrder *)context,&payload_layout);
  pCVar2 = ClientConfig::GetConfig(in_RDX);
  bVar1 = pCVar2->force_external;
  pOVar3 = unique_ptr<duckdb::OrderGlobalSinkState,_std::default_delete<duckdb::OrderGlobalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::OrderGlobalSinkState,_std::default_delete<duckdb::OrderGlobalSinkState>,_true>
                         *)&local_98);
  (pOVar3->global_sort_state).external = bVar1;
  iVar4 = PhysicalOperator::GetMaxThreadMemory(in_RDX);
  pOVar3 = unique_ptr<duckdb::OrderGlobalSinkState,_std::default_delete<duckdb::OrderGlobalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::OrderGlobalSinkState,_std::default_delete<duckdb::OrderGlobalSinkState>,_true>
                         *)&local_98);
  pOVar3->memory_per_thread = iVar4;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)local_98._M_head_impl;
  RowLayout::~RowLayout(&payload_layout);
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalOrder::GetGlobalSinkState(ClientContext &context) const {
	// Get the payload layout from the return types
	RowLayout payload_layout;
	payload_layout.Initialize(types);
	auto state = make_uniq<OrderGlobalSinkState>(context, *this, payload_layout);
	// Set external (can be force with the PRAGMA)
	state->global_sort_state.external = ClientConfig::GetConfig(context).force_external;
	state->memory_per_thread = GetMaxThreadMemory(context);
	return std::move(state);
}